

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

ssize_t __thiscall
kj::anon_unknown_36::WebSocketPipeImpl::BlockedReceive::send
          (BlockedReceive *this,int __fd,void *__buf,size_t __n,int __flags)

{
  long *plVar1;
  undefined4 in_register_00000034;
  long lVar2;
  bool bVar3;
  DebugExpression<bool> _kjCondition;
  undefined7 uStack_77;
  ArrayPtr<const_char> message_local;
  Fault f;
  
  lVar2 = CONCAT44(in_register_00000034,__fd);
  bVar3 = *(long *)(lVar2 + 0x20) == 0;
  __kjCondition = (char *)CONCAT71(uStack_77,bVar3);
  message_local.ptr = (char *)__buf;
  message_local.size_ = __n;
  if (bVar3) {
    plVar1 = *(long **)(lVar2 + 8);
    str<kj::ArrayPtr<char_const>&>
              ((String *)&_kjCondition,(kj *)&message_local,(ArrayPtr<const_char> *)__buf);
    f.exception._0_4_ = 1;
    __kjCondition = (char *)0x0;
    (**(code **)(*plVar1 + 0x10))(plVar1);
    OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close>::~OneOf
              ((OneOf<kj::String,_kj::Array<unsigned_char>,_kj::WebSocket::Close> *)&f);
    Array<char>::~Array((Array<char> *)&_kjCondition);
    if (*(long *)(*(long *)(lVar2 + 0x10) + 0x28) == lVar2) {
      *(undefined8 *)(*(long *)(lVar2 + 0x10) + 0x28) = 0;
    }
    kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
    return (ssize_t)this;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x106c,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",&_kjCondition,
             (char (*) [16])"already pumping");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

kj::Promise<void> send(kj::ArrayPtr<const char> message) override {
      KJ_REQUIRE(canceler.isEmpty(), "already pumping");
      fulfiller.fulfill(Message(kj::str(message)));
      pipe.endState(*this);
      return kj::READY_NOW;
    }